

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computation.c
# Opt level: O2

apx_rationalScaling_t * apx_rationalScaling_clone(apx_rationalScaling_t *other)

{
  apx_rationalScaling_t *paVar1;
  
  if (other != (apx_rationalScaling_t *)0x0) {
    paVar1 = apx_rationalScaling_new(other->offset,other->numerator,other->denominator,other->unit);
    if (paVar1 == (apx_rationalScaling_t *)0x0) {
      paVar1 = (apx_rationalScaling_t *)0x0;
    }
    else {
      (paVar1->base).is_signed_range = (other->base).is_signed_range;
      (paVar1->base).lower_limit = (other->base).lower_limit;
      (paVar1->base).upper_limit = (other->base).upper_limit;
    }
    return paVar1;
  }
  return (apx_rationalScaling_t *)0x0;
}

Assistant:

apx_rationalScaling_t* apx_rationalScaling_clone(apx_rationalScaling_t const* other)
{
   if (other != NULL)
   {
      apx_rationalScaling_t* self = apx_rationalScaling_new(other->offset, other->numerator, other->denominator, other->unit);
      if (self != NULL)
      {
         apx_computation_assign(&self->base, &other->base);
      }
      return self;
   }
   return NULL;
}